

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O2

int32_t ustrcase_internalToTitle_63
                  (int32_t caseLocale,uint32_t options,BreakIterator *iter,UChar *dest,
                  int32_t destCapacity,UChar *src,int32_t srcLength,Edits *edits,
                  UErrorCode *errorCode)

{
  int srcLimit;
  UBool UVar1;
  int iVar2;
  int iVar3;
  int32_t iVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint local_84;
  uint local_80;
  UChar *s;
  UCaseContext local_50;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((~options & 0x600) != 0) {
      local_50.start = 0;
      local_50.index = 0;
      local_50.cpLimit = 0;
      local_50.dir = '\0';
      local_50.b1 = '\0';
      local_50.b2 = '\0';
      local_50.b3 = '\0';
      local_50.cpStart = 0;
      local_50.limit = srcLength;
      lVar5 = 0x50;
      local_84 = 0;
      local_50.p = src;
      iVar2 = 0;
LAB_002bf3ac:
      iVar7 = iVar2;
      if (srcLength <= iVar7) {
        icu_63::anon_unknown_9::checkOverflowAndEditsError(local_84,destCapacity,edits,errorCode);
        return local_84;
      }
      iVar2 = (**(code **)((long)(iter->super_UObject)._vptr_UObject + lVar5))();
      srcLimit = srcLength;
      if (iVar2 < srcLength) {
        srcLimit = iVar2;
      }
      if (iVar2 == -1) {
        srcLimit = srcLength;
      }
      iVar3 = srcLimit;
      uVar6 = local_80;
      if (iVar7 < srcLimit) {
        iVar3 = iVar7 + 1;
        uVar6 = (uint)(ushort)src[iVar7];
        if ((((uVar6 & 0xfc00) == 0xd800) && (iVar3 != srcLimit)) &&
           (lVar5 = (long)iVar3, ((ushort)src[lVar5] & 0xfc00) == 0xdc00)) {
          iVar3 = iVar7 + 2;
          uVar6 = (uint)(ushort)src[iVar7] * 0x400 + (uint)(ushort)src[lVar5] + 0xfca02400;
        }
        iVar8 = iVar7;
        if ((options >> 9 & 1) == 0) {
LAB_002bf443:
          iVar2 = iVar3;
          iVar3 = iVar2;
          if ((options >> 10 & 1) == 0) {
            UVar1 = icu_63::ustrcase_isLNS(uVar6);
            if (UVar1 != '\0') goto LAB_002bf4ce;
          }
          else {
            iVar4 = ucase_getType_63(uVar6);
            if (iVar4 != 0) goto LAB_002bf4ce;
          }
          iVar8 = srcLimit;
          iVar3 = srcLimit;
          if (iVar2 == srcLimit) goto LAB_002bf4ce;
          iVar3 = iVar2 + 1;
          uVar6 = (uint)(ushort)src[iVar2];
          iVar8 = iVar2;
          if (((uVar6 & 0xfc00) == 0xd800) &&
             ((iVar3 != srcLimit && (((ushort)src[iVar3] & 0xfc00) == 0xdc00)))) {
            uVar6 = uVar6 * 0x400 + (uint)(ushort)src[iVar3] + 0xfca02400;
            iVar3 = iVar2 + 2;
          }
          goto LAB_002bf443;
        }
        goto LAB_002bf50d;
      }
      goto LAB_002bf6ee;
    }
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return 0;
LAB_002bf4ce:
  if ((iVar8 - iVar7 != 0 && iVar7 <= iVar8) &&
     (local_84 = icu_63::anon_unknown_9::appendUnchanged
                           (dest,local_84,destCapacity,src + iVar7,iVar8 - iVar7,options,edits),
     (int)local_84 < 0)) goto LAB_002bf720;
LAB_002bf50d:
  lVar5 = 0x68;
  iVar2 = srcLimit;
  if (iVar3 - iVar8 == 0 || iVar3 < iVar8) goto LAB_002bf3ac;
  local_50.cpStart = iVar8;
  local_50.cpLimit = iVar3;
  iVar4 = ucase_toFullTitle_63
                    (uVar6,icu_63::anon_unknown_9::utf16_caseContextIterator,&local_50,&s,caseLocale
                    );
  local_84 = icu_63::anon_unknown_9::appendResult
                       (dest,local_84,destCapacity,iVar4,s,iVar3 - iVar8,options,edits);
  if ((int)local_84 < 0) goto LAB_002bf720;
  if (((caseLocale == 5) && (iVar8 + 1 < srcLimit)) && ((UChar)(src[iVar8] | 0x20U) == 0x69)) {
    if (src[iVar8 + 1] == L'J') {
      local_84 = icu_63::anon_unknown_9::appendUnchanged
                           (dest,local_84,destCapacity,src + (long)iVar8 + 1,1,options,edits);
      if ((int)local_84 < 0) goto LAB_002bf720;
    }
    else {
      if (src[iVar8 + 1] != L'j') goto LAB_002bf62d;
      if ((int)local_84 < destCapacity) {
        dest[local_84] = L'J';
      }
      else if (local_84 == 0x7fffffff) goto LAB_002bf720;
      if (edits != (Edits *)0x0) {
        icu_63::Edits::addReplace(edits,1,1);
      }
      local_84 = local_84 + 1;
    }
    iVar3 = iVar3 + 1;
  }
LAB_002bf62d:
  if (srcLimit - iVar3 != 0 && iVar3 <= srcLimit) {
    if ((options >> 8 & 1) == 0) {
      iVar4 = icu_63::anon_unknown_9::toLower
                        (caseLocale,options,dest + local_84,destCapacity - local_84,src,&local_50,
                         iVar3,srcLimit,edits,errorCode);
      local_84 = iVar4 + local_84;
      if (*errorCode == U_BUFFER_OVERFLOW_ERROR) {
        *errorCode = U_ZERO_ERROR;
        lVar5 = 0x68;
      }
      else {
        lVar5 = 0x68;
        iVar3 = iVar7;
        uVar6 = local_84;
        if (U_ZERO_ERROR < *errorCode) {
LAB_002bf6ee:
          local_80 = uVar6;
          lVar5 = 0x68;
          iVar2 = iVar3;
          if (iVar7 < srcLimit) {
            return local_80;
          }
        }
      }
      goto LAB_002bf3ac;
    }
    local_84 = icu_63::anon_unknown_9::appendUnchanged
                         (dest,local_84,destCapacity,src + iVar3,srcLimit - iVar3,options,edits);
    if ((int)local_84 < 0) {
LAB_002bf720:
      *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      return 0;
    }
  }
  lVar5 = 0x68;
  goto LAB_002bf3ac;
}

Assistant:

U_CFUNC int32_t U_CALLCONV
ustrcase_internalToTitle(int32_t caseLocale, uint32_t options, BreakIterator *iter,
                         UChar *dest, int32_t destCapacity,
                         const UChar *src, int32_t srcLength,
                         icu::Edits *edits,
                         UErrorCode &errorCode) {
    if (!ustrcase_checkTitleAdjustmentOptions(options, errorCode)) {
        return 0;
    }

    /* set up local variables */
    UCaseContext csc=UCASECONTEXT_INITIALIZER;
    csc.p=(void *)src;
    csc.limit=srcLength;
    int32_t destIndex=0;
    int32_t prev=0;
    UBool isFirstIndex=TRUE;

    /* titlecasing loop */
    while(prev<srcLength) {
        /* find next index where to titlecase */
        int32_t index;
        if(isFirstIndex) {
            isFirstIndex=FALSE;
            index=iter->first();
        } else {
            index=iter->next();
        }
        if(index==UBRK_DONE || index>srcLength) {
            index=srcLength;
        }

        /*
         * Segment [prev..index[ into 3 parts:
         * a) skipped characters (copy as-is) [prev..titleStart[
         * b) first letter (titlecase)              [titleStart..titleLimit[
         * c) subsequent characters (lowercase)                 [titleLimit..index[
         */
        if(prev<index) {
            // Find and copy skipped characters [prev..titleStart[
            int32_t titleStart=prev;
            int32_t titleLimit=prev;
            UChar32 c;
            U16_NEXT(src, titleLimit, index, c);
            if ((options&U_TITLECASE_NO_BREAK_ADJUSTMENT)==0) {
                // Adjust the titlecasing index to the next cased character,
                // or to the next letter/number/symbol/private use.
                // Stop with titleStart<titleLimit<=index
                // if there is a character to be titlecased,
                // or else stop with titleStart==titleLimit==index.
                UBool toCased = (options&U_TITLECASE_ADJUST_TO_CASED) != 0;
                while (toCased ? UCASE_NONE==ucase_getType(c) : !ustrcase_isLNS(c)) {
                    titleStart=titleLimit;
                    if(titleLimit==index) {
                        break;
                    }
                    U16_NEXT(src, titleLimit, index, c);
                }
                if (prev < titleStart) {
                    destIndex=appendUnchanged(dest, destIndex, destCapacity,
                                              src+prev, titleStart-prev, options, edits);
                    if(destIndex<0) {
                        errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                        return 0;
                    }
                }
            }

            if(titleStart<titleLimit) {
                /* titlecase c which is from [titleStart..titleLimit[ */
                csc.cpStart=titleStart;
                csc.cpLimit=titleLimit;
                const UChar *s;
                c=ucase_toFullTitle(c, utf16_caseContextIterator, &csc, &s, caseLocale);
                destIndex=appendResult(dest, destIndex, destCapacity, c, s,
                                       titleLimit-titleStart, options, edits);
                if(destIndex<0) {
                    errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                    return 0;
                }

                /* Special case Dutch IJ titlecasing */
                if (titleStart+1 < index &&
                        caseLocale == UCASE_LOC_DUTCH &&
                        (src[titleStart] == 0x0049 || src[titleStart] == 0x0069)) {
                    if (src[titleStart+1] == 0x006A) {
                        destIndex=appendUChar(dest, destIndex, destCapacity, 0x004A);
                        if(destIndex<0) {
                            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                            return 0;
                        }
                        if(edits!=NULL) {
                            edits->addReplace(1, 1);
                        }
                        titleLimit++;
                    } else if (src[titleStart+1] == 0x004A) {
                        // Keep the capital J from getting lowercased.
                        destIndex=appendUnchanged(dest, destIndex, destCapacity,
                                                  src+titleStart+1, 1, options, edits);
                        if(destIndex<0) {
                            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                            return 0;
                        }
                        titleLimit++;
                    }
                }

                /* lowercase [titleLimit..index[ */
                if(titleLimit<index) {
                    if((options&U_TITLECASE_NO_LOWERCASE)==0) {
                        /* Normal operation: Lowercase the rest of the word. */
                        destIndex+=
                            toLower(
                                caseLocale, options,
                                dest+destIndex, destCapacity-destIndex,
                                src, &csc, titleLimit, index,
                                edits, errorCode);
                        if(errorCode==U_BUFFER_OVERFLOW_ERROR) {
                            errorCode=U_ZERO_ERROR;
                        }
                        if(U_FAILURE(errorCode)) {
                            return destIndex;
                        }
                    } else {
                        /* Optionally just copy the rest of the word unchanged. */
                        destIndex=appendUnchanged(dest, destIndex, destCapacity,
                                                  src+titleLimit, index-titleLimit, options, edits);
                        if(destIndex<0) {
                            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                            return 0;
                        }
                    }
                }
            }
        }

        prev=index;
    }

    return checkOverflowAndEditsError(destIndex, destCapacity, edits, errorCode);
}